

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile_common.c
# Opt level: O0

_Bool av1_get_uniform_tile_size(AV1_COMMON *cm,int *w,int *h)

{
  int iVar1;
  int tile_h;
  int tile_height_sb;
  int i_1;
  int tile_w;
  int tile_width_sb;
  int i;
  CommonTileParams *tiles;
  int *h_local;
  int *w_local;
  AV1_COMMON *cm_local;
  
  if ((cm->tiles).uniform_spacing == 0) {
    for (i = 0; i < (cm->tiles).cols; i = i + 1) {
      iVar1 = ((cm->tiles).col_start_sb[i + 1] - (cm->tiles).col_start_sb[i]) *
              cm->seq_params->mib_size;
      if ((i != 0) && (iVar1 != *w)) {
        return false;
      }
      *w = iVar1;
    }
    for (i_1 = 0; i_1 < (cm->tiles).rows; i_1 = i_1 + 1) {
      iVar1 = ((cm->tiles).row_start_sb[i_1 + 1] - (cm->tiles).row_start_sb[i_1]) *
              cm->seq_params->mib_size;
      if ((i_1 != 0) && (iVar1 != *h)) {
        return false;
      }
      *h = iVar1;
    }
  }
  else {
    *w = (cm->tiles).width;
    *h = (cm->tiles).height;
  }
  return true;
}

Assistant:

bool av1_get_uniform_tile_size(const AV1_COMMON *cm, int *w, int *h) {
  const CommonTileParams *const tiles = &cm->tiles;
  if (tiles->uniform_spacing) {
    *w = tiles->width;
    *h = tiles->height;
  } else {
    for (int i = 0; i < tiles->cols; ++i) {
      const int tile_width_sb =
          tiles->col_start_sb[i + 1] - tiles->col_start_sb[i];
      const int tile_w = tile_width_sb * cm->seq_params->mib_size;
      // ensure all tiles have same dimension
      if (i != 0 && tile_w != *w) {
        return false;
      }
      *w = tile_w;
    }

    for (int i = 0; i < tiles->rows; ++i) {
      const int tile_height_sb =
          tiles->row_start_sb[i + 1] - tiles->row_start_sb[i];
      const int tile_h = tile_height_sb * cm->seq_params->mib_size;
      // ensure all tiles have same dimension
      if (i != 0 && tile_h != *h) {
        return false;
      }
      *h = tile_h;
    }
  }
  return true;
}